

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed)

{
  LogMessage *pLVar1;
  undefined7 in_register_00000011;
  ExtensionInfo info;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  ExtensionInfo local_58;
  
  if ((int)CONCAT71(in_register_00000011,type) == 0xe) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9c);
    pLVar1 = LogMessage::operator<<
                       (&local_90,"CHECK failed: (type) != (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=((LogFinisher *)&local_c8,pLVar1);
    LogMessage::~LogMessage(&local_90);
  }
  if (type == '\v') {
    LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9d);
    pLVar1 = LogMessage::operator<<
                       (&local_c8,"CHECK failed: (type) != (WireFormatLite::TYPE_MESSAGE): ");
    LogFinisher::operator=((LogFinisher *)&local_100,pLVar1);
    LogMessage::~LogMessage(&local_c8);
  }
  if (type == '\n') {
    LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x9e);
    pLVar1 = LogMessage::operator<<
                       (&local_100,"CHECK failed: (type) != (WireFormatLite::TYPE_GROUP): ");
    LogFinisher::operator=((LogFinisher *)&local_58,pLVar1);
    LogMessage::~LogMessage(&local_100);
  }
  local_58.field_5.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
  local_58.field_5.enum_validity_check.arg = (void *)0x0;
  local_58.descriptor = (FieldDescriptor *)0x0;
  local_58.message = extendee;
  local_58.number = number;
  local_58.type = type;
  local_58.is_repeated = is_repeated;
  local_58.is_packed = is_packed;
  anon_unknown_26::Register(&local_58);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* extendee, int number,
                                     FieldType type, bool is_repeated,
                                     bool is_packed) {
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  Register(info);
}